

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O1

void mmk_panic(char *str,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  FILE *ctx;
  char *str_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  __va_list_tag local_d8;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.overflow_arg_area = &vl[0].overflow_arg_area;
  local_d8.gp_offset = 8;
  local_d8.fp_offset = 0x30;
  ctx = _stderr;
  local_b0 = in_RSI;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  (*mmk_vfprintf_)(_stderr,str,&local_d8);
  (*(code *)mmk_abort_)();
  mmk_vfprintf_ =
       (_func_void_FILE_ptr_char_ptr___va_list_tag_ptr *)plt_get_real_fn((plt_ctx)ctx,"vfprintf");
  mmk_abort_ = plt_get_real_fn((plt_ctx)ctx,"abort");
  if ((mmk_abort_ == (undefined1 *)0x0) ||
     (mmk_vfprintf_ == (_func_void_FILE_ptr_char_ptr___va_list_tag_ptr *)0x0)) {
    mmk_init_vital_functions_cold_1();
  }
  else {
    mmk_malloc_ = (_func_void_ptr_size_t *)plt_get_real_fn((plt_ctx)ctx,"malloc");
    if (mmk_malloc_ != (_func_void_ptr_size_t *)0x0) {
      mmk_realloc_ = (_func_void_ptr_void_ptr_size_t *)plt_get_real_fn((plt_ctx)ctx,"realloc");
      if (mmk_realloc_ == (_func_void_ptr_void_ptr_size_t *)0x0) {
        str_00 = 
        "mimick: Initialization error: could not find definition for vital function \'realloc\'.\n";
      }
      else {
        mmk_free_ = (_func_void_void_ptr *)plt_get_real_fn((plt_ctx)ctx,"free");
        if (mmk_free_ == (_func_void_void_ptr *)0x0) {
          str_00 = 
          "mimick: Initialization error: could not find definition for vital function \'free\'.\n";
        }
        else {
          mmk_mprotect_ = (_func_int_void_ptr_size_t_int *)plt_get_real_fn((plt_ctx)ctx,"mprotect");
          if (mmk_mprotect_ != (_func_int_void_ptr_size_t_int *)0x0) {
            return;
          }
          str_00 = 
          "mimick: Initialization error: could not find definition for vital function \'mprotect\'.\n"
          ;
          mmk_mprotect_ = (_func_int_void_ptr_size_t_int *)0x0;
        }
      }
      goto LAB_00103e3c;
    }
  }
  str_00 = 
  "mimick: Initialization error: could not find definition for vital function \'malloc\'.\n";
LAB_00103e3c:
  mmk_panic(str_00);
}

Assistant:

mmk_noreturn void mmk_panic(const char *str, ...)
{
    va_list vl;
    va_start(vl, str);
    mmk_vfprintf_(stderr, str, vl);
    va_end(vl);
    mmk_abort();
    mmk_unreachable();
}